

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O3

AssertionResult __thiscall
testing::internal::CmpHelperEQ<std::__cxx11::string,char[108]>
          (internal *this,char *expected_expression,char *actual_expression,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *expected,
          char (*actual) [108])

{
  int iVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_00;
  AssertionResult AVar3;
  String local_48;
  String local_38;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> sVar2
  ;
  
  iVar1 = std::__cxx11::string::compare((char *)expected);
  if (iVar1 == 0) {
    AVar3 = AssertionSuccess();
    sVar2 = AVar3.message_.ptr_;
  }
  else {
    FormatForComparisonFailureMessage<std::__cxx11::string,char[108]>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_38,
               (char (*) [108])expected);
    String::ShowCStringQuoted(&local_48,*actual);
    AVar3 = EqFailure(this,expected_expression,actual_expression,&local_38,&local_48,false);
    sVar2 = AVar3.message_.ptr_;
    if (local_48.c_str_ != (char *)0x0) {
      operator_delete__(local_48.c_str_);
      sVar2.ptr_ = extraout_RDX;
    }
    if (local_38.c_str_ != (pointer)0x0) {
      operator_delete__(local_38.c_str_);
      sVar2.ptr_ = extraout_RDX_00;
    }
  }
  AVar3.message_.ptr_ = sVar2.ptr_;
  AVar3._0_8_ = this;
  return AVar3;
}

Assistant:

AssertionResult CmpHelperEQ(const char* expected_expression,
                            const char* actual_expression,
                            const T1& expected,
                            const T2& actual) {
#ifdef _MSC_VER
# pragma warning(push)          // Saves the current warning state.
# pragma warning(disable:4389)  // Temporarily disables warning on
                               // signed/unsigned mismatch.
#endif

  if (expected == actual) {
    return AssertionSuccess();
  }

#ifdef _MSC_VER
# pragma warning(pop)          // Restores the warning state.
#endif

  return EqFailure(expected_expression,
                   actual_expression,
                   FormatForComparisonFailureMessage(expected, actual),
                   FormatForComparisonFailureMessage(actual, expected),
                   false);
}